

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O0

deUint64 vkt::texture::util::anon_unknown_1::readChannel(void *ptr,int byteOffset,int numBytes)

{
  int local_2c;
  ulong uStack_28;
  int byteNdx;
  deUint64 result;
  deUint8 *cPtr;
  int numBytes_local;
  int byteOffset_local;
  void *ptr_local;
  
  uStack_28 = 0;
  for (local_2c = 0; local_2c < numBytes; local_2c = local_2c + 1) {
    uStack_28 = uStack_28 << 8 |
                (ulong)*(byte *)((long)ptr + (long)((numBytes - local_2c) + -1) + (long)byteOffset);
  }
  return uStack_28;
}

Assistant:

deUint64 readChannel (const void* ptr,
					  const int byteOffset,
					  const int numBytes)
{
	const deUint8*	cPtr   = (const deUint8*) ptr + byteOffset;
	deUint64		result = 0;

	for (int byteNdx = 0; byteNdx < numBytes; ++byteNdx)
	{
		result = (result << 8U) | (deUint64) (cPtr[numBytes - byteNdx - 1]);
	}

	return result;
}